

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O1

void anon_unknown.dwarf_e0b43::test_copy_construction<unsigned_long>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  pointer pcVar4;
  pointer pcVar5;
  ResultBuilder *pRVar6;
  unsigned_long t;
  ulong uVar7;
  ulong uVar8;
  ResultBuilder __catchResult;
  undefined1 local_300 [40];
  pointer local_2d8;
  _Alloc_hider local_2d0;
  ResultBuilder local_2c8;
  
  uVar3 = 3;
  uVar8 = 2;
  do {
    uVar7 = uVar8;
    uVar8 = uVar3 % uVar7;
    uVar3 = uVar7;
  } while (uVar8 != 0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  pcVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) / auVar1,0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  pcVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) / auVar2,0);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_300,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x4b);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_300,"r2.num() == r1.num()",Normal,"");
  if ((ResultBuilder *)local_300._0_8_ != (ResultBuilder *)(local_300 + 0x10)) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_300._0_8_ = &local_2c8;
  local_300._8_8_ = &local_2d0;
  local_2d8 = pcVar4;
  local_2d0._M_p = pcVar4;
  pRVar6 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<unsigned_long_const&> *)local_300,(unsigned_long *)&local_2d8);
  Catch::ResultBuilder::endExpression(pRVar6);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_300,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x4c);
  Catch::ResultBuilder::ResultBuilder
            (&local_2c8,"REQUIRE",(SourceLineInfo *)local_300,"r2.denom() == r1.denom()",Normal,"");
  if ((ResultBuilder *)local_300._0_8_ != (ResultBuilder *)(local_300 + 0x10)) {
    operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
  }
  local_300._0_8_ = &local_2c8;
  local_300._8_8_ = &local_2d0;
  local_2d8 = pcVar5;
  local_2d0._M_p = pcVar5;
  pRVar6 = Catch::ExpressionLhs<unsigned_long_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<unsigned_long_const&> *)local_300,(unsigned_long *)&local_2d8);
  Catch::ResultBuilder::endExpression(pRVar6);
  Catch::ResultBuilder::shouldDebugBreak(&local_2c8);
  Catch::ResultBuilder::react(&local_2c8);
  Catch::ResultBuilder::~ResultBuilder(&local_2c8);
  return;
}

Assistant:

void test_copy_construction()
{
    using rational = tcb::rational<T>;
    
#ifdef TCB_HAVE_CONSTEXPR14
	{
		constexpr rational r1{3, 2};
        constexpr rational r2{r1};
        static_assert(r2.num() == r1.num(), "");
        static_assert(r2.denom() == r1.denom(), "");
    }
#endif

    {
		const rational r1{3, 2};
        const rational r2{r1};
        REQUIRE(r2.num() == r1.num());
        REQUIRE(r2.denom() == r1.denom());
    }
}